

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

HRESULT Memory::HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::
        GenerateValidPointersMapForBlockType(PAL_FILE *file)

{
  code *pcVar1;
  HRESULT HVar2;
  HRESULT HVar3;
  bool bVar4;
  int iVar5;
  HRESULT HVar6;
  undefined4 *puVar7;
  ValidPointersMapTable *validTable;
  InvalidBitsTable *invalidTable;
  BlockInfoMapTable *blockInfoTable;
  ulong uVar8;
  ushort *puVar9;
  char16_t *pcVar10;
  ulong uVar11;
  ulong uVar12;
  Type *pTVar13;
  bool bVar14;
  ushort *local_68;
  
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x133,"(file != nullptr)","file != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  validTable = (ValidPointersMapTable *)malloc(0x3a000);
  invalidTable = (InvalidBitsTable *)malloc(0x1d00);
  blockInfoTable = (BlockInfoMapTable *)malloc(0x3a0);
  HVar6 = -0x7fffbffb;
  if (blockInfoTable != (BlockInfoMapTable *)0x0 &&
      (invalidTable != (InvalidBitsTable *)0x0 && validTable != (ValidPointersMapTable *)0x0)) {
    GenerateValidPointersMap(validTable,invalidTable,blockInfoTable);
    iVar5 = PAL_fwprintf(file,L"#if USE_VPM_TABLE\n");
    if ((-1 < iVar5) &&
       (iVar5 = PAL_fwprintf(file,
                             L"const ushort HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::validPointersBuffer[MediumAllocationBlockAttributes::BucketCount][HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::rowSize] = \n{\n"
                            ), -1 < iVar5)) {
      iVar5 = PAL_fwprintf(file,L"    {\n        ");
      if (iVar5 < 0) {
        bVar4 = false;
        HVar3 = -0x7fffbffb;
      }
      else {
        puVar9 = (*validTable)[0] + 1;
        HVar6 = 0;
        bVar4 = false;
        uVar12 = 0;
        do {
          bVar14 = false;
          iVar5 = PAL_fwprintf(file,L"0x%04hX, ",(ulong)(*validTable)[uVar12][0]);
          if (iVar5 < 0) {
            HVar6 = -0x7fffbffb;
          }
          else {
            uVar11 = 0;
            do {
              uVar8 = uVar11;
              if (uVar8 == 0xfff) goto LAB_006e9a02;
              pcVar10 = L"0x%04hX, ";
              if (uVar8 == 0xffe) {
                pcVar10 = L"0x%04hX";
              }
              iVar5 = PAL_fwprintf(file,pcVar10,(ulong)puVar9[uVar8]);
              uVar11 = uVar8 + 1;
            } while (-1 < iVar5);
            HVar6 = -0x7fffbffb;
LAB_006e9a02:
            bVar14 = 0xffe < uVar8;
          }
          HVar3 = HVar6;
          if (!bVar14) break;
          pcVar10 = L"\n    },\n";
          if (uVar12 == 0x1c) {
            pcVar10 = L"\n    }\n";
          }
          iVar5 = PAL_fwprintf(file,pcVar10);
          HVar3 = -0x7fffbffb;
          if (iVar5 < 0) break;
          bVar4 = 0x1b < uVar12;
          HVar3 = HVar6;
          if (uVar12 + 1 == 0x1d) break;
          iVar5 = PAL_fwprintf(file,L"    {\n        ");
          puVar9 = puVar9 + 0x1000;
          uVar12 = uVar12 + 1;
          HVar3 = -0x7fffbffb;
        } while (-1 < iVar5);
      }
      HVar6 = HVar3;
      if (bVar4) {
        iVar5 = PAL_fwprintf(file,L"};\n");
        HVar6 = -0x7fffbffb;
        if (((-1 < iVar5) && (iVar5 = PAL_fwprintf(file,L"#endif // USE_VPM_TABLE\n\n"), -1 < iVar5)
            ) && (iVar5 = PAL_fwprintf(file,
                                       L"const BVUnit HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData[MediumAllocationBlockAttributes::BucketCount][SmallHeapBlockT<MediumAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n"
                                      ), -1 < iVar5)) {
          iVar5 = PAL_fwprintf(file,L"    {\n        ");
          if (iVar5 < 0) {
            bVar4 = false;
LAB_006e9c6c:
            HVar2 = -0x7fffbffb;
          }
          else {
            pTVar13 = (*invalidTable)[0].data + 1;
            bVar4 = false;
            uVar12 = 0;
            do {
              bVar14 = false;
              iVar5 = PAL_fwprintf(file,L"0x%016I64X, ",(*invalidTable)[uVar12].data[0].word);
              HVar6 = -0x7fffbffb;
              if (-1 < iVar5) {
                uVar11 = 0;
                do {
                  uVar8 = uVar11;
                  HVar6 = HVar3;
                  if (uVar8 == 0x1f) goto LAB_006e9bbd;
                  pcVar10 = L"0x%016I64X, ";
                  if (uVar8 == 0x1e) {
                    pcVar10 = L"0x%016I64X";
                  }
                  iVar5 = PAL_fwprintf(file,pcVar10,pTVar13[uVar8].word);
                  uVar11 = uVar8 + 1;
                } while (-1 < iVar5);
                HVar6 = -0x7fffbffb;
LAB_006e9bbd:
                bVar14 = 0x1e < uVar8;
              }
              HVar2 = HVar6;
              if (!bVar14) break;
              pcVar10 = L"\n    },\n";
              if (uVar12 == 0x1c) {
                pcVar10 = L"\n    }\n";
              }
              iVar5 = PAL_fwprintf(file,pcVar10);
              if (iVar5 < 0) goto LAB_006e9c6c;
              bVar4 = 0x1b < uVar12;
              if (uVar12 + 1 == 0x1d) break;
              HVar2 = -0x7fffbffb;
              iVar5 = PAL_fwprintf(file,L"    {\n        ");
              pTVar13 = pTVar13 + 0x20;
              uVar12 = uVar12 + 1;
              HVar3 = HVar6;
            } while (-1 < iVar5);
          }
          HVar6 = HVar2;
          if (bVar4) {
            iVar5 = PAL_fwprintf(file,
                                 L"};\n// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\nconst HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsBuffers =\n    reinterpret_cast<const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData);\n"
                                );
            HVar6 = -0x7fffbffb;
            if ((-1 < iVar5) &&
               (iVar5 = PAL_fwprintf(file,
                                     L"const SmallHeapBlockT<MediumAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::blockInfoBuffer[MediumAllocationBlockAttributes::BucketCount][MediumAllocationBlockAttributes::PageCount] = {\n"
                                    ), -1 < iVar5)) {
              local_68 = &(*blockInfoTable)[0][0].pageObjectCount;
              uVar12 = 0;
              do {
                uVar11 = uVar12;
                HVar6 = HVar2;
                if (uVar11 == 0x1d) goto LAB_006e9e3f;
                iVar5 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",uVar11 & 0xffffffff,
                                     (ulong)((int)(uVar11 + 1) * 0x100 + 0x300));
                HVar6 = -0x7fffbffb;
                if ((iVar5 < 0) || (iVar5 = PAL_fwprintf(file,L"    {\n"), iVar5 < 0))
                goto LAB_006e9e3f;
                bVar4 = false;
                iVar5 = PAL_fwprintf(file,L"        { ");
                if (iVar5 < 0) {
                  HVar6 = -0x7fffbffb;
                }
                else {
                  bVar4 = false;
                  uVar12 = 0;
                  HVar6 = HVar2;
                  do {
                    bVar14 = false;
                    iVar5 = PAL_fwprintf(file,L"0x%04hX, 0x%04hX",(ulong)local_68[uVar12 * 2 + -1],
                                         (ulong)local_68[uVar12 * 2]);
                    if (iVar5 < 0) {
                      HVar6 = -0x7fffbffb;
                    }
                    else {
                      pcVar10 = L"\n    },\n";
                      if (uVar12 == 7) {
                        pcVar10 = L"\n    }\n";
                      }
                      iVar5 = PAL_fwprintf(file,pcVar10 + 4);
                      bVar14 = -1 < iVar5;
                      if (!bVar14) {
                        HVar6 = -0x7fffbffb;
                      }
                    }
                    if ((!bVar14) || (bVar4 = 6 < uVar12, uVar12 == 7)) goto LAB_006e9de8;
                    iVar5 = PAL_fwprintf(file,L"        { ");
                    uVar12 = uVar12 + 1;
                  } while (-1 < iVar5);
                  HVar6 = -0x7fffbffb;
                }
LAB_006e9de8:
                if (!bVar4) goto LAB_006e9e3f;
                pcVar10 = L"\n    },\n";
                if (uVar11 == 0x1c) {
                  pcVar10 = L"\n    }\n";
                }
                iVar5 = PAL_fwprintf(file,pcVar10 + 1);
                local_68 = local_68 + 0x10;
                uVar12 = uVar11 + 1;
                HVar2 = HVar6;
              } while (-1 < iVar5);
              HVar6 = -0x7fffbffb;
LAB_006e9e3f:
              if ((0x1c < uVar11) && (iVar5 = PAL_fwprintf(file,L"};\n"), iVar5 < 0)) {
                HVar6 = -0x7fffbffb;
              }
            }
          }
        }
      }
    }
  }
  free(validTable);
  free(invalidTable);
  return HVar6;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(FILE* file)
{
#define IfErrorGotoCleanup(result) if ((result) < 0) { hr = E_FAIL; goto cleanup; }

    Assert(file != nullptr);
    HRESULT hr = S_OK;

    // Use heap to allocate the table so we don't bloat the stack (~64k). We only use this function
    // to generate headers as part of testing.
    ValidPointersMapTable *valid = (ValidPointersMapTable *)malloc(sizeof(ValidPointersMapTable));
    InvalidBitsTable *invalid = (InvalidBitsTable *)malloc(sizeof(InvalidBitsTable));
    BlockInfoMapTable *blockMap = (BlockInfoMapTable *)malloc(sizeof(BlockInfoMapTable));

    if (valid == nullptr || invalid == nullptr || blockMap == nullptr)
    {
        hr = E_FAIL;
        goto cleanup;
    }
    GenerateValidPointersMap(valid, *invalid, *blockMap);

    IfErrorGotoCleanup(fwprintf(file, _u("#if USE_VPM_TABLE\n")))
    IfErrorGotoCleanup(fwprintf(file, _u("const ushort HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::validPointersBuffer[MediumAllocationBlockAttributes::BucketCount][HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::rowSize] = \n{\n")));
    // Generate the full buffer.
    for (unsigned i = 0; i < HeapConstants::MediumBucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));
        for (unsigned j = 0; j < rowSize; ++j)
        {
            IfErrorGotoCleanup(fwprintf(
                file,
                (j < rowSize - 1) ? _u("0x%04hX, ") : _u("0x%04hX"),
                (*valid)[i][j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::MediumBucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));
    IfErrorGotoCleanup(fwprintf(file, _u("#endif // USE_VPM_TABLE\n\n")))

    // Generate the invalid bitvectors.
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const BVUnit HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData[MediumAllocationBlockAttributes::BucketCount][SmallHeapBlockT<MediumAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::MediumBucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));

        for (unsigned j = 0; j < (*invalid)[i].wordCount; ++j)
        {
            const char16 *format = (j < (*invalid)[i].wordCount - 1) ?
#if defined(TARGET_32)
                _u("0x%08X, ") : _u("0x%08X")
#elif defined(TARGET_64)
                _u("0x%016I64X, ") : _u("0x%016I64X")
#else
#error "Platform is not handled"
#endif
                ;
            IfErrorGotoCleanup(fwprintf(file, format, (*invalid)[i].GetRawData()[j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::MediumBucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("};\n")
        _u("// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\n")
        _u("const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsBuffers =\n")
        _u("    reinterpret_cast<const HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::invalidBitsData);\n")));

    // Generate the block map table
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const SmallHeapBlockT<MediumAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<MediumAllocationBlockAttributes>::blockInfoBuffer[MediumAllocationBlockAttributes::BucketCount][MediumAllocationBlockAttributes::PageCount] = {\n")));

    for (unsigned i = 0; i < HeapConstants::MediumBucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    // Bucket: %u, Size: %d\n"), i, (int)(HeapConstants::MaxSmallObjectSize + ((i + 1) * MediumAllocationBlockAttributes::BucketGranularity))));
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n")));

        for (unsigned j = 0; j < MediumAllocationBlockAttributes::PageCount; ++j)
        {
            IfErrorGotoCleanup(fwprintf(file, _u("        { ")));

            const char16 *format = _u("0x%04hX, 0x%04hX");
            IfErrorGotoCleanup(fwprintf(file, format, (*blockMap)[i][j].lastObjectIndexOnPage, (*blockMap)[i][j].pageObjectCount));
            IfErrorGotoCleanup(fwprintf(file, (j < MediumAllocationBlockAttributes::PageCount - 1 ? _u(" },\n") : _u(" }\n"))));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::MediumBucketCount - 1 ? _u("    },\n") : _u("    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));

cleanup:
#undef IfErrorGotoCleanup
    free(valid);
    free(invalid);
    return hr;
}